

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_rectangle_gradient(rf_rec rec,rf_color col1,rf_color col2,rf_color col3,rf_color col4)

{
  float local_88;
  float fStack_84;
  float local_58;
  float fStack_54;
  uint local_48;
  
  rf_get_shapes_texture();
  rf_gfx_enable_texture(local_48);
  rf_gfx_push_matrix();
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(col1.r,col1.g,col1.b,col1.a);
  rf_gfx_tex_coord2f((rf__ctx->field_0).rec_tex_shapes.x /
                     (float)(rf__ctx->field_0).tex_shapes.width,
                     (rf__ctx->field_0).rec_tex_shapes.y /
                     (float)(rf__ctx->field_0).tex_shapes.height);
  local_58 = rec.x;
  fStack_54 = rec.y;
  rf_gfx_vertex2f(local_58,fStack_54);
  rf_gfx_color4ub(col2.r,col2.g,col2.b,col2.a);
  rf_gfx_tex_coord2f((rf__ctx->field_0).rec_tex_shapes.x /
                     (float)(rf__ctx->field_0).tex_shapes.width,
                     ((rf__ctx->field_0).rec_tex_shapes.y + (rf__ctx->field_0).rec_tex_shapes.height
                     ) / (float)(rf__ctx->field_0).tex_shapes.height);
  local_88 = rec.width;
  fStack_84 = rec.height;
  rf_gfx_vertex2f(local_58,fStack_84 + fStack_54);
  rf_gfx_color4ub(col3.r,col3.g,col3.b,col3.a);
  rf_gfx_tex_coord2f(((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width)
                     / (float)(rf__ctx->field_0).tex_shapes.width,
                     ((rf__ctx->field_0).rec_tex_shapes.y + (rf__ctx->field_0).rec_tex_shapes.height
                     ) / (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f(local_88 + local_58,fStack_84 + fStack_54);
  rf_gfx_color4ub(col4.r,col4.g,col4.b,col4.a);
  rf_gfx_tex_coord2f(((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width)
                     / (float)(rf__ctx->field_0).tex_shapes.width,
                     (rf__ctx->field_0).rec_tex_shapes.y /
                     (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f(local_88 + local_58,fStack_54);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_rectangle_gradient(rf_rec rec, rf_color col1, rf_color col2, rf_color col3, rf_color col4)
{
    rf_gfx_enable_texture(rf_get_shapes_texture().id);

    rf_gfx_push_matrix();
    rf_gfx_begin(RF_QUADS);
    rf_gfx_normal3f(0.0f, 0.0f, 1.0f);

    // NOTE: Default raylib font character 95 is a white square
    rf_gfx_color4ub(col1.r, col1.g, col1.b, col1.a);
    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x, rec.y);

    rf_gfx_color4ub(col2.r, col2.g, col2.b, col2.a);
    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x, rec.y + rec.height);

    rf_gfx_color4ub(col3.r, col3.g, col3.b, col3.a);
    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x + rec.width, rec.y + rec.height);

    rf_gfx_color4ub(col4.r, col4.g, col4.b, col4.a);
    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x + rec.width, rec.y);
    rf_gfx_end();
    rf_gfx_pop_matrix();

    rf_gfx_disable_texture();
}